

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskContainer.cpp
# Opt level: O2

int __thiscall
DataContainer::InitUnzip(DataContainer *this,ITypeManager *manager,uchar *zipped_buffer,int size)

{
  int iVar1;
  char *__s;
  NodeFS *pNVar2;
  ushort uVar3;
  size_t __n;
  string *node_name;
  int iVar4;
  uint uVar5;
  bool bVar6;
  allocator<char> local_bd;
  uint local_bc;
  NodeFS *local_b8;
  int local_b0;
  int local_ac;
  uchar *local_a8;
  ITypeManager *local_a0;
  ulong local_98;
  string local_90;
  string local_70;
  string local_50;
  
  uVar5 = 0xffffffff;
  while ((0 < size && (uVar5 == 0xffffffff))) {
    size = size - 1;
    uVar5 = 0xffffffff;
    if (*(int *)(zipped_buffer + (uint)size) == 0x6054b50) {
      uVar5 = size;
    }
  }
  iVar4 = -1;
  if (uVar5 != 0xffffffff) {
    uVar3 = *(ushort *)(zipped_buffer + (ulong)uVar5 + 8);
    iVar4 = *(int *)(zipped_buffer + (ulong)uVar5 + 0x10);
    local_b8 = &this->zip_file_;
    if ((short)uVar3 < 1) {
      uVar3 = 0;
    }
    uVar5 = (uint)uVar3;
    local_a8 = zipped_buffer;
    local_a0 = manager;
    while (bVar6 = uVar5 != 0, uVar5 = uVar5 - 1, bVar6) {
      if (*(int *)(zipped_buffer + iVar4) != 0x2014b50) {
        return -1;
      }
      iVar1 = *(int *)(zipped_buffer + (long)iVar4 + 0x26);
      local_bc = *(uint *)(zipped_buffer + (long)iVar4 + 0x2a);
      local_ac = (int)*(short *)(zipped_buffer + (long)iVar4 + 0x1c);
      __n = (size_t)local_ac;
      local_b0 = (int)*(short *)(zipped_buffer + (long)iVar4 + 0x1e);
      local_98 = (ulong)(uint)(int)*(short *)(zipped_buffer + (long)iVar4 + 0x20);
      __s = (char *)operator_new__(__n + 1);
      memcpy(__s,zipped_buffer + (long)iVar4 + 0x2e,__n);
      __s[__n] = '\0';
      if (iVar1 == 0x10) {
        node_name = &local_50;
        std::__cxx11::string::string<std::allocator<char>>((string *)node_name,__s,&local_bd);
        pNVar2 = NodeFS::InsertDir(local_b8,node_name);
        zipped_buffer = local_a8;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,__s,&local_bd);
        zipped_buffer = local_a8;
        pNVar2 = NodeFS::InsertFile(local_b8,&local_70,local_a8);
        std::__cxx11::string::~string((string *)&local_70);
        pNVar2->offset_ = local_bc;
        node_name = &local_90;
        std::__cxx11::string::string((string *)node_name,(string *)&pNVar2->name_);
        (**local_a0->_vptr_ITypeManager)(local_a0,node_name);
      }
      std::__cxx11::string::~string((string *)node_name);
      if ((pNVar2 != (NodeFS *)0x0) && (*(int *)(zipped_buffer + (int)local_bc) == 0x4034b50)) {
        pNVar2->offset_ = local_bc;
      }
      iVar4 = iVar4 + local_ac + local_b0 + (int)local_98 + 0x2e;
    }
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int DataContainer::InitUnzip(ITypeManager* manager, unsigned char* zipped_buffer, int size)
{
   auto return_value = -1;

   // ZIP format : Find EOCD
   int offset_eocd = -1;
   for (int offset = size - 1; offset >= 0 && offset_eocd == -1; offset --)
   {
      if (*(unsigned int*)(&zipped_buffer[offset]) == 0x06054B50)
      {
         offset_eocd = offset;
      }
   }
   if (offset_eocd != -1)
   {
      return_value = 0;
      // Found : Get infos.
      int nb_central_dir = *(short*)&(zipped_buffer[offset_eocd + 8]);
      int offset_dir = *(int*)&(zipped_buffer[offset_eocd + 16]);

      // Now, look at central directories
      for (int cd = 0; cd < nb_central_dir; cd ++)
      {
         // Check signature
         if (*(unsigned int*)(&zipped_buffer[offset_dir]) == 0x02014b50)
         {
            // check version min
            // Compression method
            short min_version = *(short*)&(zipped_buffer[offset_dir + 6]);
            short comp_method = *(short*)&(zipped_buffer[offset_dir + 10]);
            short ifile_attrib = *(short*)&(zipped_buffer[offset_dir + 36]);
            int efile_attrib = *(int*)&(zipped_buffer[offset_dir + 38]);

            //
            int off_local_header = *(int*)&(zipped_buffer[offset_dir + 42]);
            // Sizes
            int filename_size = *(short*)(&zipped_buffer[offset_dir + 28]);
            int extra_size = *(short*)(&zipped_buffer[offset_dir + 30]);
            int Comment_size = *(short*)(&zipped_buffer[offset_dir + 32]);
            char* filename = new char [filename_size + 1];
            memcpy(filename, &zipped_buffer[offset_dir + 46], filename_size);
            filename[filename_size] = 0;

            // Directory ?
            NodeFS* added_element;
            if (efile_attrib == FILE_ATTRIBUTE_DIRECTORY)
            {
               // New node :
               added_element = zip_file_.InsertDir(filename);
            }
            else
            {
               // File
               added_element = zip_file_.InsertFile(filename, zipped_buffer);

               added_element->offset_ = off_local_header;
               // Update file type count
               int file_type = manager->GetTypeFromFile(added_element->name_);
            }

            // local file header
            unsigned char* local_header = &zipped_buffer[off_local_header];
            if (*(unsigned int*)(&local_header[0]) == 0x04034b50)
            {
               short min_version = *(short*)&(local_header[4]);
               short flags = *(short*)&(local_header[6]);
               short comp_method = *(short*)&(local_header[8]);

               if (added_element != nullptr)
               {
                  added_element->offset_ = off_local_header;
               }
            }
            offset_dir += 46 + filename_size + extra_size + Comment_size;
         }
         else
         {
            // Error !
            return -1;
         }
      }
   }
   return return_value;
}